

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

char * GetOpName(SynUnaryOpType type)

{
  char *pcStack_10;
  SynUnaryOpType type_local;
  
  switch(type) {
  case SYN_UNARY_OP_PLUS:
    pcStack_10 = "+";
    break;
  case SYN_UNARY_OP_NEGATE:
    pcStack_10 = "-";
    break;
  case SYN_UNARY_OP_BIT_NOT:
    pcStack_10 = "~";
    break;
  case SYN_UNARY_OP_LOGICAL_NOT:
    pcStack_10 = "!";
    break;
  default:
    __assert_fail("!\"unknown operation type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                  ,0xe98,"const char *GetOpName(SynUnaryOpType)");
  }
  return pcStack_10;
}

Assistant:

const char* GetOpName(SynUnaryOpType type)
{
	switch(type)
	{
	case SYN_UNARY_OP_PLUS:
		return "+";
	case SYN_UNARY_OP_NEGATE:
		return "-";
	case SYN_UNARY_OP_BIT_NOT:
		return "~";
	case SYN_UNARY_OP_LOGICAL_NOT:
		return "!";
	default:
		break;
	}

	assert(!"unknown operation type");
	return "";
}